

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeMahonyFilter.cpp
# Opt level: O0

bool __thiscall
iDynTree::AttitudeMahonyFilter::setInternalState
          (AttitudeMahonyFilter *this,Span<double,__1L> *stateBuffer)

{
  element_type eVar1;
  index_type iVar2;
  long lVar3;
  reference peVar4;
  double *pdVar5;
  long *in_RDI;
  index_type in_stack_ffffffffffffff88;
  element_type eVar6;
  Span<double,__1L> *in_stack_ffffffffffffff90;
  Span<double,__1L> *this_00;
  
  iVar2 = Span<double,_-1L>::size((Span<double,__1L> *)0x616842);
  lVar3 = (**(code **)(*in_RDI + 0x40))();
  if (iVar2 == lVar3) {
    peVar4 = Span<double,_-1L>::operator()(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    eVar6 = *peVar4;
    pdVar5 = VectorFixSize<4U>::operator()((VectorFixSize<4U> *)(in_RDI + 6),0);
    *pdVar5 = eVar6;
    peVar4 = Span<double,_-1L>::operator()(in_stack_ffffffffffffff90,(index_type)eVar6);
    this_00 = (Span<double,__1L> *)*peVar4;
    pdVar5 = VectorFixSize<4U>::operator()((VectorFixSize<4U> *)(in_RDI + 6),1);
    *pdVar5 = (double)this_00;
    peVar4 = Span<double,_-1L>::operator()(this_00,(index_type)eVar6);
    eVar1 = *peVar4;
    pdVar5 = VectorFixSize<4U>::operator()((VectorFixSize<4U> *)(in_RDI + 6),2);
    *pdVar5 = eVar1;
    peVar4 = Span<double,_-1L>::operator()(this_00,(index_type)eVar6);
    eVar1 = *peVar4;
    pdVar5 = VectorFixSize<4U>::operator()((VectorFixSize<4U> *)(in_RDI + 6),3);
    *pdVar5 = eVar1;
    peVar4 = Span<double,_-1L>::operator()(this_00,(index_type)eVar6);
    eVar1 = *peVar4;
    pdVar5 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 10),0);
    *pdVar5 = eVar1;
    peVar4 = Span<double,_-1L>::operator()(this_00,(index_type)eVar6);
    eVar1 = *peVar4;
    pdVar5 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 10),1);
    *pdVar5 = eVar1;
    peVar4 = Span<double,_-1L>::operator()(this_00,(index_type)eVar6);
    eVar1 = *peVar4;
    pdVar5 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 10),2);
    *pdVar5 = eVar1;
    peVar4 = Span<double,_-1L>::operator()(this_00,(index_type)eVar6);
    eVar1 = *peVar4;
    pdVar5 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0xd),0);
    *pdVar5 = eVar1;
    peVar4 = Span<double,_-1L>::operator()(this_00,(index_type)eVar6);
    eVar1 = *peVar4;
    pdVar5 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0xd),1);
    *pdVar5 = eVar1;
    peVar4 = Span<double,_-1L>::operator()(this_00,(index_type)eVar6);
    eVar6 = *peVar4;
    pdVar5 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0xd),2);
    *pdVar5 = eVar6;
  }
  else {
    iDynTree::reportError
              ("AttitudeMahonyFilter","setInternalState","state size mismatch, using default state")
    ;
  }
  return iVar2 == lVar3;
}

Assistant:

bool iDynTree::AttitudeMahonyFilter::setInternalState(const iDynTree::Span< double >& stateBuffer)
{
    if ((size_t)stateBuffer.size() != getInternalStateSize())
    {
        iDynTree::reportError("AttitudeMahonyFilter", "setInternalState", "state size mismatch, using default state");
        return false;
    }
    m_state_mahony.m_orientation(0) = stateBuffer(0);
    m_state_mahony.m_orientation(1) = stateBuffer(1);
    m_state_mahony.m_orientation(2) = stateBuffer(2);
    m_state_mahony.m_orientation(3) = stateBuffer(3);
    m_state_mahony.m_angular_velocity(0) = stateBuffer(4);
    m_state_mahony.m_angular_velocity(1) = stateBuffer(5);
    m_state_mahony.m_angular_velocity(2) = stateBuffer(6);
    m_state_mahony.m_gyroscope_bias(0) = stateBuffer(7);
    m_state_mahony.m_gyroscope_bias(1) = stateBuffer(8);
    m_state_mahony.m_gyroscope_bias(2) = stateBuffer(9);
    return true;
}